

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseUser_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *psVar1;
  allocator local_39;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_38,"id",&local_39);
    appendToJson<int>(this,__return_storage_ptr__,&local_38,
                      &((object->super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       )->id);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"is_bot",&local_39);
    appendToJson(this,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  isBot);
    std::__cxx11::string::~string((string *)&local_38);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"first_name",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  firstName);
    std::__cxx11::string::~string((string *)&local_38);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"last_name",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  lastName);
    std::__cxx11::string::~string((string *)&local_38);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"username",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  username);
    std::__cxx11::string::~string((string *)&local_38);
    psVar1 = &local_38;
    std::__cxx11::string::string((string *)psVar1,"language_code",&local_39);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  languageCode);
    std::__cxx11::string::~string((string *)&local_38);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseUser(const User::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "id", object->id);
    appendToJson(result, "is_bot", object->isBot);
    appendToJson(result, "first_name", object->firstName);
    appendToJson(result, "last_name", object->lastName);
    appendToJson(result, "username", object->username);
    appendToJson(result, "language_code", object->languageCode);
    removeLastComma(result);
    result += '}';
    return result;
}